

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

void CVmObjBigNum::compute_exp_into(char *dst,char *src)

{
  ushort uVar1;
  short sVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  err_frame_t *peVar7;
  CVmException *pCVar8;
  int iVar9;
  undefined8 *puVar10;
  long *plVar11;
  ulong uVar12;
  int16_t tmp;
  ulong uVar13;
  int iVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  char *ext1;
  char *ext2;
  char *ext3;
  char *ext5;
  char *ext4;
  char *ext6;
  uint hdl6;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  char *local_130;
  char *local_128;
  char *local_120;
  ulong local_118;
  err_frame_t err_cur__;
  
  uVar1 = *(ushort *)dst;
  local_120 = src;
  local_128 = cache_ln10((ulong)uVar1 + 3);
  alloc_temp_regs((ulong)uVar1 + 3,6,&ext1,&hdl1,&ext2,&hdl2,&ext3,&hdl3,&ext4,&hdl4,&ext5,&hdl5,
                  &ext6,&hdl6);
  puVar10 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar10;
  plVar11 = (long *)_ZTW11G_err_frame();
  *plVar11 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  pcVar3 = local_128;
  if (err_cur__.state_ == 0) {
    local_130 = dst;
    compute_quotient_into(ext1,(char *)0x0,local_120,local_128);
    sVar2 = *(short *)(ext1 + 2);
    bVar15 = 0;
    uVar16 = 0;
    uVar17 = uVar16;
    for (; (-1 < sVar2 && (uVar16 < (uint)(int)sVar2)); uVar16 = uVar16 + 1) {
      if (uVar16 < *(ushort *)ext1) {
        uVar13 = (ulong)((uint)(int)ext1[(uVar16 >> 1) + 5] >> (~bVar15 & 4) & 0xf);
      }
      else {
        uVar13 = 0;
      }
      uVar17 = uVar17 * 10 + uVar13;
      if ((long)((ulong)((byte)ext1[4] & 1) * 3 + 0x7ffe) < (long)uVar17) {
        err_throw(0x7e7);
      }
      if (uVar16 < *(ushort *)ext1) {
        ext1[(uVar16 >> 1) + 5] = ext1[(uVar16 >> 1) + 5] & '\x0f' << (bVar15 & 4);
      }
      bVar15 = bVar15 + 4;
    }
    bVar15 = ext1[4];
    normalize(ext1);
    compute_prod_into(ext3,ext1,pcVar3);
    copy_val(ext1,(char *)"\x01",0);
    uVar16 = 2;
    div_by_long(ext1,2,(unsigned_long *)0x0);
    iVar14 = 0;
    while (iVar9 = compare_abs(ext3,ext1), 0 < iVar9) {
      div_by_long(ext3,2,(unsigned_long *)0x0);
      iVar14 = iVar14 + -1;
    }
    local_118 = -uVar17;
    if ((bVar15 & 1) == 0) {
      local_118 = uVar17;
    }
    copy_val(ext2,(char *)"\x01",0);
    compute_sum_into(ext1,ext2,ext3);
    compute_prod_into(ext2,ext3,ext3);
    copy_val(ext4,(char *)"\x01",0);
    mul_by_long(ext4,2);
    bVar5 = true;
    uVar17 = 3;
    while( true ) {
      if (bVar5) {
        copy_val(ext5,ext2,0);
        div_by_long(ext5,uVar16,(unsigned_long *)0x0);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar17;
        uVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xccccccccccccccc)) / auVar6,0);
        bVar5 = uVar16 <= uVar12;
        uVar13 = uVar17;
        if (uVar12 < uVar16) {
          uVar13 = 1;
        }
        uVar16 = uVar13 * uVar16;
      }
      else {
        compute_quotient_into(ext5,(char *)0x0,ext2,ext4);
        bVar5 = false;
      }
      pcVar3 = local_130;
      if (((ext5[4] & 8U) != 0) ||
         ((int)(uint)*(ushort *)ext1 < (int)*(short *)(ext1 + 2) - (int)*(short *)(ext5 + 2)))
      break;
      compute_sum_into(ext6,ext1,ext5);
      pcVar3 = ext1;
      ext1 = ext6;
      ext6 = pcVar3;
      mul_by_long(ext4,uVar17);
      compute_prod_into(ext5,ext2,ext3);
      pcVar3 = ext2;
      ext2 = ext5;
      uVar17 = uVar17 + 1;
      ext5 = pcVar3;
    }
    for (; iVar14 != 0; iVar14 = iVar14 + 1) {
      compute_prod_into(ext2,ext1,ext1);
      pcVar4 = ext1;
      ext1 = ext2;
      ext2 = pcVar4;
    }
    copy_val(ext2,(char *)"\x01",0);
    *(short *)(ext2 + 2) = (short)local_118 + 1;
    compute_prod_into(ext3,ext1,ext2);
    copy_val(pcVar3,ext3,1);
  }
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    release_temp_regs(6,(ulong)hdl1,(ulong)hdl2,(ulong)hdl3,(ulong)hdl4,(ulong)hdl5,(ulong)hdl6);
  }
  peVar7 = err_cur__.prv_;
  puVar10 = (undefined8 *)_ZTW11G_err_frame();
  *puVar10 = peVar7;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar10 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar10 & 2) != 0) {
      plVar11 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar11 + 0x10));
    }
    pCVar8 = err_cur__.exc_;
    plVar11 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar11 + 0x10) = pCVar8;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_exp_into(char *dst, const char *src)
{
    uint hdl1, hdl2, hdl3, hdl4, hdl5, hdl6;
    char *ext1, *ext2, *ext3, *ext4, *ext5, *ext6;
    size_t prec = get_prec(dst);
    const char *ln10;

    /* get the constant value of ln10 to the required precision */
    ln10 = cache_ln10(prec + 3);

    /* allocate temporary registers */
    alloc_temp_regs(prec + 3, 6,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5, &ext6, &hdl6);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        char *tmp;
        ulong n;
        ulong n_fact;
        int use_int_fact;
        long new_exp;
        size_t idx;
        size_t decpt_idx;
        int twos;

        /*
         *   We want to calculate e^x.  Observe that a^x = e^(x*ln(x)), so
         *   10^x = e^(x*ln(10)).  We can rewrite our desired expression
         *   e^x as 
         *   
         *   e^[(x/ln(10)) * ln(10)]
         *   
         *   which is thus
         *   
         *   10^(x / ln(10))
         *   
         *   We store our numbers as a mantissa times 10 raised to an
         *   integer exponent.  Clearly the exponent of 10 in the formula
         *   above is not always an integer (in fact, it's extremely rare
         *   that it would be an integer), so we still have more work to
         *   do.  What we must do is obtain an integer exponent.  So, let
         *   us define y = x/ln(10); we can now rewrite the above as
         *   
         *   10^(int(y) + frac(y))
         *   
         *   where int(y) is the integer portion of y and frac(y) is the
         *   fractional portion (y - int(y)).  We can rewrite the above as
         *   
         *   10^frac(y) * 10^int(y)
         *   
         *   which we can further rewrite as
         *   
         *   e^(frac(y)*ln(10)) * 10^int(y)
         *   
         *   We haven't made the problem of finding an exponential
         *   disappear, but we've reduced the argument to a very
         *   manageable range, which is important because it makes the
         *   Taylor series converge quickly.  Furthermore, it's extremely
         *   inexpensive to separate out the problem like this, since it
         *   falls quite naturally out of the representation we use, so it
         *   doesn't add much overhead to do this preparation work.  
         */

        /* first, calculate x/ln(10) into r1 */
        compute_quotient_into(ext1, 0, src, ln10);

        /* 
         *   compute the integer portion of x/ln(10) - it has to fit in a
         *   16-bit integer, (-32768 to +32767), because this is going to
         *   be the exponent of the result (or roughly so, anyway) 
         */
        decpt_idx = get_exp(ext1) >= 0 ? (size_t)get_exp(ext1) : 0;
        for (new_exp = 0, idx = 0 ; idx < decpt_idx ; ++idx)
        {
            int dig;

            /* 
             *   get this digit if it's represented; if not, it's an
             *   implied trailing zero 
             */
            dig = (idx < get_prec(ext1) ? get_dig(ext1, idx) : 0);
            
            /* add this digit into the accumulator */
            new_exp *= 10;
            new_exp += dig;

            /* 
             *   Make sure we're still in range.  Note that, because our
             *   representation is 0.dddd*10^x, we need one more factor of
             *   ten than you'd think here, the adjust of the range from
             *   the expected -32768..32767 
             */
            if (new_exp > (get_neg(ext1) ? 32769L : 32766L))
                err_throw(VMERR_NUM_OVERFLOW);

            /* 
             *   zero out this digit, so that when we're done r1 has the
             *   fractional part only 
             */
            if (idx < get_prec(ext1))
                set_dig(ext1, idx, 0);
        }

        /* negate the exponent value if the source value is negative */
        if (get_neg(ext1))
            new_exp = -new_exp;

        /* normalize the fractional part, which remains in ext1 */
        normalize(ext1);

        /* 
         *   Multiply it by ln10, storing the result in r3.  This is the
         *   value we'll use with the Taylor series. 
         */
        compute_prod_into(ext3, ext1, ln10);

        /* 
         *   While our input value is greater than 0.5, divide it by two to
         *   make it smaller than 0.5.  This will speed up the series
         *   convergence.  When we're done, we'll correct for the divisions
         *   by squaring the result the same number of times that we halved
         *   'x', because e^2x = (e^x)^2.
         */
        copy_val(ext1, get_one(), FALSE);
        div_by_long(ext1, 2);
        for (twos = 0 ; compare_abs(ext3, ext1) > 0 ; ++twos)
            div_by_long(ext3, 2);

        /* 
         *   Start with 1+x in our accumulator (r1).  This unrolls the
         *   trivial first two steps of the loop, where n=0 (term=1) and n=1
         *   (term=x). 
         */
        copy_val(ext2, get_one(), FALSE);
        compute_sum_into(ext1, ext2, ext3);

        /* get term n=2 (x^2) into the current-power register (r2) */
        compute_prod_into(ext2, ext3, ext3);

        /* start with 2 in our factorial register (r4) */
        copy_val(ext4, get_one(), FALSE);
        mul_by_long(ext4, 2);

        /* start at term n=2, n! = 2 */
        n = 2;
        n_fact = 2;
        use_int_fact = TRUE;

        /* go until we reach the required precision */
        for (;;)
        {
            /* for efficiency, try integer division */
            if (use_int_fact)
            {
                /* 
                 *   we can still fit the factorial in an integer - divide
                 *   by the integer value of n!, since it's a lot faster 
                 */
                copy_val(ext5, ext2, FALSE);
                div_by_long(ext5, n_fact);

                /* calculate the next n! integer, if it'll fit in a long */
                if (n_fact > LONG_MAX/10/(n+1))
                {
                    /* 
                     *   it'll be too big next time - we'll have to start
                     *   using the full quotient calculation 
                     */
                    use_int_fact = FALSE;
                }
                else
                {
                    /* it'll still fit - calculate the next n! */
                    n_fact *= (n+1);
                }
            }
            else
            {
                /* compute x^n/n! (r2/r4) into r5 */
                compute_quotient_into(ext5, 0, ext2, ext4);
            }

            /* if we're below the required precision, we're done */
            if (is_zero(ext5)
                || get_exp(ext1) - get_exp(ext5) > (int)get_prec(ext1))
                break;

            /* compute the sum of the accumulator and this term into r6 */
            compute_sum_into(ext6, ext1, ext5);

            /* swap the result into the accumulator */
            tmp = ext1;
            ext1 = ext6;
            ext6 = tmp;

            /* on to the next term */
            ++n;

            /* compute the next factorial value */
            mul_by_long(ext4, n);

            /* compute the next power of x' into r5 */
            compute_prod_into(ext5, ext2, ext3);

            /* swap the result into our current-power register (r2) */
            tmp = ext2;
            ext2 = ext5;
            ext5 = tmp;
        }

        /* square the result as many times as we halved the argument */
        for ( ; twos != 0 ; --twos)
        {
            /* compute the square of r1 into r2 */
            compute_prod_into(ext2, ext1, ext1);

            /* swap the result back into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /* 
         *   set up our 10's exponent value - this is simply 1*10^new_exp,
         *   which we calculated earlier (which we represent as
         *   0.1*10^(new_exp+1)
         */
        copy_val(ext2, get_one(), FALSE);
        set_exp(ext2, (int)(new_exp + 1));

        /* multiply by the 10's exponent value */
        compute_prod_into(ext3, ext1, ext2);

        /* copy the result into the output register, rounding as needed */
        copy_val(dst, ext3, TRUE);
    }